

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNodeSetRemove(xmlNodeSetPtr cur,int val)

{
  int local_14;
  int val_local;
  xmlNodeSetPtr cur_local;
  
  if ((cur != (xmlNodeSetPtr)0x0) && (val < cur->nodeNr)) {
    if ((cur->nodeTab[val] != (xmlNodePtr)0x0) && (cur->nodeTab[val]->type == XML_NAMESPACE_DECL)) {
      xmlXPathNodeSetFreeNs((xmlNsPtr)cur->nodeTab[val]);
    }
    cur->nodeNr = cur->nodeNr + -1;
    for (local_14 = val; local_14 < cur->nodeNr; local_14 = local_14 + 1) {
      cur->nodeTab[local_14] = cur->nodeTab[local_14 + 1];
    }
    cur->nodeTab[cur->nodeNr] = (xmlNodePtr)0x0;
  }
  return;
}

Assistant:

void
xmlXPathNodeSetRemove(xmlNodeSetPtr cur, int val) {
    if (cur == NULL) return;
    if (val >= cur->nodeNr) return;
    if ((cur->nodeTab[val] != NULL) &&
	(cur->nodeTab[val]->type == XML_NAMESPACE_DECL))
	xmlXPathNodeSetFreeNs((xmlNsPtr) cur->nodeTab[val]);
    cur->nodeNr--;
    for (;val < cur->nodeNr;val++)
        cur->nodeTab[val] = cur->nodeTab[val + 1];
    cur->nodeTab[cur->nodeNr] = NULL;
}